

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_scan_sse2_128_32.c
# Opt level: O2

parasail_result_t *
parasail_nw_stats_table_scan_profile_sse2_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  undefined1 (*pauVar1) [16];
  undefined1 (*pauVar2) [12];
  int *piVar3;
  uint *puVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  void *pvVar7;
  void *pvVar8;
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  uint uVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  parasail_result_t *ppVar20;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int32_t *ptr_06;
  uint uVar21;
  size_t len;
  ulong uVar22;
  __m128i *palVar23;
  __m128i *palVar24;
  __m128i *palVar25;
  char *pcVar26;
  undefined8 extraout_RDX;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  longlong extraout_RDX_05;
  uint uVar27;
  int iVar28;
  int32_t t;
  ulong uVar29;
  long lVar30;
  char *__format;
  long lVar31;
  uint uVar32;
  undefined4 uVar33;
  int32_t d;
  __m128i *palVar34;
  int iVar35;
  ulong size;
  ulong uVar36;
  bool bVar37;
  int iVar38;
  int iVar48;
  int iVar49;
  int iVar50;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  __m128i alVar47;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  __m128i alVar56;
  int iVar57;
  int iVar60;
  int iVar61;
  int iVar63;
  undefined1 auVar58 [16];
  long lVar62;
  __m128i alVar59;
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  long lVar67;
  __m128i alVar66;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  uint uVar82;
  uint uVar89;
  uint uVar90;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  uint uVar91;
  undefined1 auVar88 [16];
  undefined1 auVar92 [16];
  uint uVar93;
  uint uVar94;
  uint uVar98;
  uint uVar99;
  uint uVar100;
  uint uVar101;
  uint uVar102;
  uint uVar103;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  uint uVar104;
  uint uVar107;
  uint uVar108;
  undefined1 auVar105 [16];
  uint uVar109;
  undefined1 auVar106 [16];
  uint uVar110;
  uint uVar111;
  uint uVar112;
  uint uVar113;
  uint uVar114;
  uint uVar115;
  uint uVar116;
  uint uVar117;
  uint uVar118;
  uint uVar120;
  uint uVar121;
  uint uVar122;
  undefined1 auVar119 [16];
  uint uVar123;
  uint uVar124;
  uint uVar125;
  uint uVar126;
  uint uVar127;
  uint uVar128;
  uint uVar129;
  uint uVar130;
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i c_02;
  __m128i c_03;
  __m128i c_04;
  __m128i c_05;
  __m128i vH;
  __m128i vH_00;
  __m128i vH_01;
  __m128i vH_02;
  int32_t in_stack_fffffffffffffd68;
  undefined1 local_228 [16];
  uint local_218;
  uint uStack_214;
  uint uStack_210;
  uint uStack_20c;
  int local_208;
  int iStack_204;
  int iStack_200;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  undefined1 local_168 [16];
  undefined1 local_128 [16];
  __m128i_32_t h;
  longlong extraout_RDX_00;
  ulong uVar39;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar26 = "profile";
  }
  else {
    pvVar5 = (profile->profile32).score;
    if (pvVar5 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar26 = "profile->profile32.score";
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar26 = "profile->matrix";
      }
      else {
        uVar21 = profile->s1Len;
        if ((int)uVar21 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar26 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar26 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar26 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar26 = "open";
        }
        else {
          if (-1 < gap) {
            uVar27 = uVar21 - 1;
            size = (ulong)uVar21 + 3 >> 2;
            uVar39 = (ulong)uVar27 % size;
            iVar35 = -open;
            iVar57 = ppVar6->min;
            uVar19 = 0x80000000 - iVar57;
            if (iVar57 != iVar35 && SBORROW4(iVar57,iVar35) == iVar57 + open < 0) {
              uVar19 = open | 0x80000000;
            }
            pvVar7 = (profile->profile32).matches;
            uVar15 = 0x7ffffffe - ppVar6->max;
            pvVar8 = (profile->profile32).similar;
            uVar32 = uVar19;
            ppVar20 = parasail_result_new_table3((uint)((ulong)uVar21 + 3) & 0x7ffffffc,s2Len);
            if (ppVar20 != (parasail_result_t *)0x0) {
              ppVar20->flag = ppVar20->flag | 0x4430401;
              b = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              b_01 = parasail_memalign___m128i(0x10,size);
              b_02 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              b_03 = parasail_memalign___m128i(0x10,size);
              b_04 = parasail_memalign___m128i(0x10,size);
              b_05 = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign___m128i(0x10,size);
              ptr_01 = parasail_memalign___m128i(0x10,size);
              ptr_02 = parasail_memalign___m128i(0x10,size);
              ptr_03 = parasail_memalign___m128i(0x10,size);
              ptr_04 = parasail_memalign___m128i(0x10,size);
              ptr_05 = parasail_memalign___m128i(0x10,size);
              uVar29 = CONCAT44(0,s2Len + 1);
              local_228._8_8_ = local_228._0_8_;
              local_228._0_8_ = uVar29;
              ptr_06 = parasail_memalign_int32_t(0x10,uVar29);
              len = CONCAT71((int7)((ulong)ptr >> 8),ptr_04 == (__m128i *)0x0);
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = ptr_06 == (int32_t *)0x0;
              auVar76._0_4_ = -(uint)((int)b == 0);
              auVar76._4_4_ = -(uint)((int)((ulong)b >> 0x20) == 0);
              auVar76._8_4_ = -(uint)((int)b_00 == 0);
              auVar76._12_4_ = -(uint)((int)((ulong)b_00 >> 0x20) == 0);
              auVar83._4_4_ = auVar76._0_4_;
              auVar83._0_4_ = auVar76._4_4_;
              auVar83._8_4_ = auVar76._12_4_;
              auVar83._12_4_ = auVar76._8_4_;
              auVar84._0_4_ = -(uint)((int)b_01 == 0);
              auVar84._4_4_ = -(uint)((int)((ulong)b_01 >> 0x20) == 0);
              auVar84._8_4_ = -(uint)((int)b_02 == 0);
              auVar84._12_4_ = -(uint)((int)((ulong)b_02 >> 0x20) == 0);
              auVar77._4_4_ = auVar84._0_4_;
              auVar77._0_4_ = auVar84._4_4_;
              auVar77._8_4_ = auVar84._12_4_;
              auVar77._12_4_ = auVar84._8_4_;
              auVar84 = packssdw(auVar83 & auVar76,auVar77 & auVar84);
              auVar131._0_4_ = -(uint)((int)ptr == 0);
              auVar131._4_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0);
              auVar131._8_4_ = -(uint)((int)b_03 == 0);
              auVar131._12_4_ = -(uint)((int)((ulong)b_03 >> 0x20) == 0);
              auVar70._4_4_ = auVar131._0_4_;
              auVar70._0_4_ = auVar131._4_4_;
              auVar70._8_4_ = auVar131._12_4_;
              auVar70._12_4_ = auVar131._8_4_;
              auVar58._0_4_ = -(uint)((int)b_04 == 0);
              auVar58._4_4_ = -(uint)((int)((ulong)b_04 >> 0x20) == 0);
              auVar58._8_4_ = -(uint)((int)b_05 == 0);
              auVar58._12_4_ = -(uint)((int)((ulong)b_05 >> 0x20) == 0);
              auVar92._4_4_ = auVar58._0_4_;
              auVar92._0_4_ = auVar58._4_4_;
              auVar92._8_4_ = auVar58._12_4_;
              auVar92._12_4_ = auVar58._8_4_;
              auVar71 = packssdw(auVar70 & auVar131,auVar92 & auVar58);
              auVar71 = packssdw(auVar84,auVar71);
              auVar85 = packsswb(auVar71,auVar71);
              auVar71._0_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
              auVar71._4_4_ = -(uint)((int)ptr_01 == 0 && (int)((ulong)ptr_01 >> 0x20) == 0);
              auVar71._8_4_ = -(uint)((int)ptr_02 == 0 && (int)((ulong)ptr_02 >> 0x20) == 0);
              auVar71._12_4_ = -(uint)((int)ptr_03 == 0 && (int)((ulong)ptr_03 >> 0x20) == 0);
              uVar33 = movmskps(uVar32,auVar71);
              if (((ptr_05 != (__m128i *)0x0 && ptr_04 != (__m128i *)0x0) &&
                  ptr_06 != (int32_t *)0x0) &&
                  ((char)uVar33 == '\0' &&
                  ((((((((auVar85 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                        (auVar85 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar85 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar85 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar85 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar85 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar85 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar85 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0))) {
                iVar16 = s2Len + -1;
                iVar17 = uVar19 + 1;
                iVar28 = (int)size;
                iVar18 = -(iVar28 * gap);
                c[0] = size;
                parasail_memset___m128i(b_03,c,len);
                c_00[1] = extraout_RDX_00;
                c_00[0] = size;
                parasail_memset___m128i(b_04,c_00,len);
                c_01[1] = extraout_RDX_01;
                c_01[0] = size;
                parasail_memset___m128i(b_05,c_01,len);
                c_02[1] = extraout_RDX_02;
                c_02[0] = size;
                parasail_memset___m128i(b,c_02,len);
                c_03[1] = extraout_RDX_03;
                c_03[0] = size;
                parasail_memset___m128i(b_00,c_03,len);
                c_04[1] = extraout_RDX_04;
                c_04[0] = size;
                parasail_memset___m128i(b_01,c_04,len);
                c_05[1] = extraout_RDX_05;
                c_05[0] = size;
                parasail_memset___m128i(b_02,c_05,len);
                iVar57 = -open;
                iVar60 = -open;
                iVar61 = -open;
                iVar63 = -open;
                iVar38 = 1;
                iVar48 = 1;
                iVar49 = 1;
                iVar50 = 1;
                uVar19 = iVar28 - 1;
                for (uVar21 = uVar19; -1 < (int)uVar21; uVar21 = uVar21 - 1) {
                  palVar23 = ptr_04 + uVar21;
                  *(int *)*palVar23 = iVar57;
                  *(int *)((long)*palVar23 + 4) = iVar60;
                  *(int *)(*palVar23 + 1) = iVar61;
                  *(int *)((long)*palVar23 + 0xc) = iVar63;
                  palVar23 = ptr_05 + uVar21;
                  *(int *)*palVar23 = iVar38;
                  *(int *)((long)*palVar23 + 4) = iVar48;
                  *(int *)(*palVar23 + 1) = iVar49;
                  *(int *)((long)*palVar23 + 0xc) = iVar50;
                  iVar57 = iVar57 - gap;
                  iVar60 = iVar60 - gap;
                  iVar61 = iVar61 - gap;
                  iVar63 = iVar63 - gap;
                  iVar38 = iVar38 + 1;
                  iVar48 = iVar48 + 1;
                  iVar49 = iVar49 + 1;
                  iVar50 = iVar50 + 1;
                }
                iVar57 = iVar35;
                for (uVar22 = 0; uVar22 != size; uVar22 = uVar22 + 1) {
                  iVar60 = iVar57;
                  for (lVar31 = 0; lVar31 != 4; lVar31 = lVar31 + 1) {
                    *(int *)((long)&h + lVar31 * 4) = iVar60;
                    iVar60 = iVar60 - iVar28 * gap;
                  }
                  ptr[uVar22][0] = h.m[0];
                  ptr[uVar22][1] = h.m[1];
                  iVar57 = iVar57 - gap;
                }
                *ptr_06 = 0;
                for (uVar22 = 1; uVar29 != uVar22; uVar22 = uVar22 + 1) {
                  ptr_06[uVar22] = iVar35;
                  iVar35 = iVar35 - gap;
                }
                palVar23 = ptr + uVar19;
                palVar24 = b_03 + uVar19;
                palVar25 = b_04 + uVar19;
                auVar53._4_4_ = uVar15;
                auVar53._0_4_ = uVar15;
                auVar53._8_4_ = uVar15;
                auVar53._12_4_ = uVar15;
                local_128._4_4_ = iVar17;
                local_128._0_4_ = iVar17;
                local_128._12_4_ = iVar17;
                local_128._8_4_ = iVar17;
                uVar29 = 0;
                local_218 = uVar15;
                while (uVar22 = uVar29, uVar22 != (uint)s2Len) {
                  iStack_1f4 = (int)(*palVar24)[0];
                  iStack_1f0 = *(int *)((long)*palVar24 + 4);
                  iStack_204 = (int)(*palVar25)[0];
                  iStack_200 = *(int *)((long)*palVar25 + 4);
                  uVar29 = b_05[uVar19][0];
                  local_1f8 = 0;
                  local_208 = 0;
                  auVar9._4_8_ = auVar85._8_8_;
                  auVar9._0_4_ = (int)(*palVar23)[0];
                  auVar86._0_8_ = auVar9._0_8_ << 0x20;
                  auVar86._8_4_ = *(undefined4 *)((long)*palVar23 + 4);
                  auVar86._12_4_ = (int)(*palVar23)[1];
                  auVar72._0_8_ = uVar29 << 0x20;
                  auVar72._8_8_ = b_05[uVar19][1] << 0x20 | uVar29 >> 0x20;
                  auVar87._4_12_ = auVar86._4_12_;
                  auVar87._0_4_ = ptr_06[uVar22];
                  lVar31 = (long)(ppVar6->mapper[(byte)s2[uVar22]] * iVar28) * 0x10;
                  auVar78._4_4_ = iVar17;
                  auVar78._0_4_ = iVar17;
                  auVar78._8_4_ = iVar17;
                  auVar78._12_4_ = iVar17;
                  uVar118 = iVar17 - (int)(*ptr_04)[0];
                  uVar120 = iVar17 - *(int *)((long)*ptr_04 + 4);
                  uVar121 = iVar17 - (int)(*ptr_04)[1];
                  uVar122 = iVar17 - *(int *)((long)*ptr_04 + 0xc);
                  auVar131 = (undefined1  [16])0x0;
                  auVar71 = (undefined1  [16])0x0;
                  lVar30 = 0;
                  auVar58 = (undefined1  [16])0x0;
                  uVar21 = (uint)(*palVar24)[1];
                  uVar32 = (uint)(*palVar25)[1];
                  while( true ) {
                    uVar93 = local_218;
                    if (size << 4 == lVar30) break;
                    pauVar1 = (undefined1 (*) [16])((long)*ptr + lVar30);
                    auVar92 = *pauVar1;
                    piVar3 = (int *)((long)*b + lVar30);
                    uVar93 = *(int *)*pauVar1 - open;
                    uVar98 = *(int *)(*pauVar1 + 4) - open;
                    uVar100 = *(int *)(*pauVar1 + 8) - open;
                    uVar102 = *(int *)(*pauVar1 + 0xc) - open;
                    uVar123 = -(uint)(*piVar3 - gap < (int)uVar93);
                    uVar125 = -(uint)(piVar3[1] - gap < (int)uVar98);
                    uVar127 = -(uint)(piVar3[2] - gap < (int)uVar100);
                    uVar129 = -(uint)(piVar3[3] - gap < (int)uVar102);
                    uVar94 = uVar93 & uVar123 | ~uVar123 & *piVar3 - gap;
                    uVar99 = uVar98 & uVar125 | ~uVar125 & piVar3[1] - gap;
                    uVar101 = uVar100 & uVar127 | ~uVar127 & piVar3[2] - gap;
                    uVar103 = uVar102 & uVar129 | ~uVar129 & piVar3[3] - gap;
                    puVar4 = (uint *)((long)*b_00 + lVar30);
                    pauVar2 = (undefined1 (*) [12])((long)*b_03 + lVar30);
                    auVar9 = *pauVar2;
                    uVar11 = *(uint *)pauVar2[1];
                    uVar110 = *(uint *)*pauVar2 & uVar123 | ~uVar123 & *puVar4;
                    uVar111 = *(uint *)(*pauVar2 + 4) & uVar125 | ~uVar125 & puVar4[1];
                    uVar112 = *(uint *)(*pauVar2 + 8) & uVar127 | ~uVar127 & puVar4[2];
                    uVar113 = uVar11 & uVar129 | ~uVar129 & puVar4[3];
                    puVar4 = (uint *)((long)*b_01 + lVar30);
                    pauVar2 = (undefined1 (*) [12])((long)*b_04 + lVar30);
                    auVar10 = *pauVar2;
                    uVar12 = *(uint *)pauVar2[1];
                    uVar114 = *(uint *)*pauVar2 & uVar123 | ~uVar123 & *puVar4;
                    uVar115 = *(uint *)(*pauVar2 + 4) & uVar125 | ~uVar125 & puVar4[1];
                    uVar116 = *(uint *)(*pauVar2 + 8) & uVar127 | ~uVar127 & puVar4[2];
                    uVar117 = uVar12 & uVar129 | ~uVar129 & puVar4[3];
                    pauVar1 = (undefined1 (*) [16])((long)*b_05 + lVar30);
                    uVar124 = *(uint *)*pauVar1;
                    uVar126 = *(uint *)(*pauVar1 + 4);
                    uVar128 = *(uint *)(*pauVar1 + 8);
                    uVar130 = *(uint *)(*pauVar1 + 0xc);
                    auVar84 = *pauVar1;
                    puVar4 = (uint *)((long)*b_02 + lVar30);
                    uVar93 = *puVar4;
                    uVar98 = puVar4[1];
                    uVar100 = puVar4[2];
                    uVar102 = puVar4[3];
                    piVar3 = (int *)((long)*ptr_04 + lVar30);
                    auVar119._0_4_ = uVar118 + *piVar3;
                    auVar119._4_4_ = uVar120 + piVar3[1];
                    auVar119._8_4_ = uVar121 + piVar3[2];
                    auVar119._12_4_ = uVar122 + piVar3[3];
                    auVar132._0_4_ = -(uint)(auVar78._0_4_ < auVar119._0_4_);
                    auVar132._4_4_ = -(uint)(auVar78._4_4_ < auVar119._4_4_);
                    auVar132._8_4_ = -(uint)(auVar78._8_4_ < auVar119._8_4_);
                    auVar132._12_4_ = -(uint)(auVar78._12_4_ < auVar119._12_4_);
                    auVar78 = ~auVar132 & auVar78 | auVar119 & auVar132;
                    auVar71 = local_228 & auVar132 | ~auVar132 & auVar71;
                    piVar3 = (int *)((long)*ptr_05 + lVar30);
                    auVar105._0_4_ = local_218 + *piVar3;
                    auVar105._4_4_ = uStack_214 + piVar3[1];
                    auVar105._8_4_ = uStack_210 + piVar3[2];
                    auVar105._12_4_ = uStack_20c + piVar3[3];
                    auVar58 = local_168 & auVar132 | ~auVar132 & auVar58;
                    auVar131 = ~auVar132 & auVar131 | auVar105 & auVar132;
                    piVar3 = (int *)((long)pvVar5 + lVar30 + lVar31);
                    uVar82 = auVar87._0_4_ + *piVar3;
                    uVar89 = auVar87._4_4_ + piVar3[1];
                    uVar90 = auVar87._8_4_ + piVar3[2];
                    uVar91 = auVar87._12_4_ + piVar3[3];
                    piVar3 = (int *)((long)pvVar7 + lVar30 + lVar31);
                    iVar57 = *piVar3;
                    iVar35 = piVar3[1];
                    iVar60 = piVar3[2];
                    iVar61 = piVar3[3];
                    piVar3 = (int *)((long)pvVar8 + lVar30 + lVar31);
                    iVar63 = *piVar3;
                    iVar38 = piVar3[1];
                    iVar48 = piVar3[2];
                    iVar49 = piVar3[3];
                    uVar104 = -(uint)((int)uVar82 < (int)uVar94);
                    uVar107 = -(uint)((int)uVar89 < (int)uVar99);
                    uVar108 = -(uint)((int)uVar90 < (int)uVar101);
                    uVar109 = -(uint)((int)uVar91 < (int)uVar103);
                    puVar4 = (uint *)((long)*b + lVar30);
                    *puVar4 = uVar94;
                    puVar4[1] = uVar99;
                    puVar4[2] = uVar101;
                    puVar4[3] = uVar103;
                    uVar118 = ~uVar104 & uVar82 | uVar94 & uVar104;
                    uVar120 = ~uVar107 & uVar89 | uVar99 & uVar107;
                    uVar121 = ~uVar108 & uVar90 | uVar101 & uVar108;
                    uVar122 = ~uVar109 & uVar91 | uVar103 & uVar109;
                    puVar4 = (uint *)((long)*b_00 + lVar30);
                    *puVar4 = uVar110;
                    puVar4[1] = uVar111;
                    puVar4[2] = uVar112;
                    puVar4[3] = uVar113;
                    local_228._4_4_ = ~uVar107 & iStack_1f4 + iVar35 | uVar111 & uVar107;
                    local_228._0_4_ = ~uVar104 & local_1f8 + iVar57 | uVar110 & uVar104;
                    local_228._8_4_ = ~uVar108 & iStack_1f0 + iVar60 | uVar112 & uVar108;
                    local_228._12_4_ = ~uVar109 & uVar21 + iVar61 | uVar113 & uVar109;
                    puVar4 = (uint *)((long)*b_01 + lVar30);
                    *puVar4 = uVar114;
                    puVar4[1] = uVar115;
                    puVar4[2] = uVar116;
                    puVar4[3] = uVar117;
                    local_168._4_4_ = ~uVar107 & iStack_204 + iVar38 | uVar115 & uVar107;
                    local_168._0_4_ = ~uVar104 & local_208 + iVar63 | uVar114 & uVar104;
                    local_168._8_4_ = ~uVar108 & iStack_200 + iVar48 | uVar116 & uVar108;
                    local_168._12_4_ = ~uVar109 & uVar32 + iVar49 | uVar117 & uVar109;
                    uVar124 = (~uVar123 & uVar93 | uVar124 & uVar123) + 1;
                    uVar126 = (~uVar125 & uVar98 | uVar126 & uVar125) + 1;
                    uVar128 = (~uVar127 & uVar100 | uVar128 & uVar127) + 1;
                    uVar130 = (~uVar129 & uVar102 | uVar130 & uVar129) + 1;
                    uVar93 = auVar72._0_4_ + 1;
                    uVar98 = auVar72._4_4_ + 1;
                    uVar100 = auVar72._8_4_ + 1;
                    uVar102 = auVar72._12_4_ + 1;
                    puVar4 = (uint *)((long)*b_02 + lVar30);
                    *puVar4 = uVar124;
                    puVar4[1] = uVar126;
                    puVar4[2] = uVar128;
                    puVar4[3] = uVar130;
                    local_218 = ~uVar104 & uVar93 | uVar124 & uVar104;
                    uStack_214 = ~uVar107 & uVar98 | uVar126 & uVar107;
                    uStack_210 = ~uVar108 & uVar100 | uVar128 & uVar108;
                    uStack_20c = ~uVar109 & uVar102 | uVar130 & uVar109;
                    puVar4 = (uint *)((long)*ptr + lVar30);
                    *puVar4 = uVar82;
                    puVar4[1] = uVar89;
                    puVar4[2] = uVar90;
                    puVar4[3] = uVar91;
                    puVar4 = (uint *)((long)*b_03 + lVar30);
                    *puVar4 = local_1f8 + iVar57;
                    puVar4[1] = iStack_1f4 + iVar35;
                    puVar4[2] = iStack_1f0 + iVar60;
                    puVar4[3] = uVar21 + iVar61;
                    puVar4 = (uint *)((long)*b_04 + lVar30);
                    *puVar4 = local_208 + iVar63;
                    puVar4[1] = iStack_204 + iVar38;
                    puVar4[2] = iStack_200 + iVar48;
                    puVar4[3] = uVar32 + iVar49;
                    puVar4 = (uint *)((long)*b_05 + lVar30);
                    *puVar4 = uVar93;
                    puVar4[1] = uVar98;
                    puVar4[2] = uVar100;
                    puVar4[3] = uVar102;
                    lVar30 = lVar30 + 0x10;
                    local_1f8 = auVar9._0_4_;
                    iStack_1f4 = auVar9._4_4_;
                    iStack_1f0 = auVar9._8_4_;
                    local_208 = auVar10._0_4_;
                    iStack_204 = auVar10._4_4_;
                    iStack_200 = auVar10._8_4_;
                    auVar72 = auVar84;
                    auVar87 = auVar92;
                    uVar21 = uVar11;
                    uVar32 = uVar12;
                  }
                  auVar88._0_8_ = local_228._0_8_ << 0x20;
                  auVar88._8_8_ = local_228._8_8_ << 0x20 | (ulong)local_228._0_8_ >> 0x20;
                  auVar95._0_8_ = local_168._0_8_ << 0x20;
                  auVar95._8_8_ = local_168._8_8_ << 0x20 | (ulong)local_168._0_8_ >> 0x20;
                  uStack_20c = uStack_210;
                  uVar32 = uStack_214;
                  uVar21 = local_218;
                  auVar10._4_8_ = auVar72._8_8_;
                  auVar10._0_4_ = uVar118;
                  auVar73._0_8_ = auVar10._0_8_ << 0x20;
                  auVar73._8_4_ = uVar120;
                  auVar73._12_4_ = uVar121;
                  iVar57 = ptr_06[uVar22 + 1];
                  auVar74._4_12_ = auVar73._4_12_;
                  auVar74._0_4_ = iVar57;
                  auVar40._0_4_ = (int)(*ptr_04)[0] + iVar57;
                  auVar40._4_4_ = *(int *)((long)*ptr_04 + 4) + uVar118;
                  auVar40._8_4_ = (int)(*ptr_04)[1] + uVar120;
                  auVar40._12_4_ = *(int *)((long)*ptr_04 + 0xc) + uVar121;
                  auVar79._0_4_ = -(uint)(auVar40._0_4_ < auVar78._0_4_);
                  auVar79._4_4_ = -(uint)(auVar40._4_4_ < auVar78._4_4_);
                  auVar79._8_4_ = -(uint)(auVar40._8_4_ < auVar78._8_4_);
                  auVar79._12_4_ = -(uint)(auVar40._12_4_ < auVar78._12_4_);
                  auVar92 = auVar78 & auVar79 | ~auVar79 & auVar40;
                  auVar71 = auVar71 & auVar79 | ~auVar79 & auVar88;
                  auVar58 = auVar58 & auVar79 | ~auVar79 & auVar95;
                  local_218 = 0;
                  auVar41._4_4_ = *(int *)((long)*ptr_05 + 4) + uVar93;
                  auVar41._0_4_ = (int)(*ptr_05)[0];
                  auVar41._8_4_ = (int)(*ptr_05)[1] + uStack_214;
                  auVar41._12_4_ = *(int *)((long)*ptr_05 + 0xc) + uStack_210;
                  auVar131 = ~auVar79 & auVar41 | auVar131 & auVar79;
                  iVar35 = 2;
                  while( true ) {
                    auVar64._0_8_ = auVar131._0_8_ << 0x20;
                    auVar64._8_8_ = auVar131._8_8_ << 0x20 | auVar131._0_8_ >> 0x20;
                    auVar85._0_8_ = auVar71._0_8_ << 0x20;
                    auVar85._8_8_ = auVar71._8_8_ << 0x20 | auVar71._0_8_ >> 0x20;
                    auVar97._0_8_ = auVar58._0_8_ << 0x20;
                    auVar97._8_8_ = auVar58._8_8_ << 0x20 | auVar58._0_8_ >> 0x20;
                    bVar37 = iVar35 == 0;
                    iVar35 = iVar35 + -1;
                    auVar81._4_4_ = auVar92._0_4_;
                    auVar81._8_4_ = auVar92._4_4_;
                    auVar81._12_4_ = auVar92._8_4_;
                    if (bVar37) break;
                    auVar42._4_4_ = auVar81._4_4_ + iVar18;
                    auVar42._0_4_ = iVar17;
                    auVar42._8_4_ = auVar81._8_4_ + iVar18;
                    auVar42._12_4_ = auVar81._12_4_ + iVar18;
                    auVar96._0_4_ = -(uint)(iVar17 < auVar81._4_4_);
                    auVar96._4_4_ = -(uint)(auVar42._4_4_ < auVar81._8_4_);
                    auVar96._8_4_ = -(uint)(auVar42._8_4_ < auVar81._12_4_);
                    auVar96._12_4_ = -(uint)(auVar42._12_4_ < auVar92._12_4_);
                    auVar92 = auVar92 & auVar96 | ~auVar96 & auVar42;
                    auVar71 = auVar71 & auVar96 | ~auVar96 & auVar85;
                    auVar58 = auVar58 & auVar96 | ~auVar96 & auVar97;
                    auVar14._4_4_ = auVar131._4_4_ + iVar28;
                    auVar14._0_4_ = auVar131._0_4_ + iVar28;
                    auVar14._8_4_ = auVar131._8_4_ + iVar28;
                    auVar14._12_4_ = 0;
                    auVar131 = auVar131 & auVar96 | ~auVar96 & auVar14 << 0x20;
                  }
                  auVar81._0_4_ = iVar17;
                  auVar51._0_4_ = -(uint)(iVar57 < iVar17);
                  auVar51._4_4_ = -(uint)((int)uVar118 < auVar81._4_4_);
                  auVar51._8_4_ = -(uint)((int)uVar120 < auVar81._8_4_);
                  auVar51._12_4_ = -(uint)((int)uVar121 < auVar81._12_4_);
                  auVar92 = ~auVar51 & auVar74 | auVar81 & auVar51;
                  auVar58 = auVar85 & auVar51 | ~auVar51 & auVar88;
                  auVar131 = auVar97 & auVar51 | ~auVar51 & auVar95;
                  auVar13._4_4_ = uStack_214;
                  auVar13._0_4_ = uVar93;
                  auVar13._8_4_ = uStack_210;
                  auVar13._12_4_ = 0;
                  auVar71 = ~auVar51 & auVar13 << 0x20 | auVar64 & auVar51;
                  lVar31 = 0;
                  for (uVar36 = 0; uVar29 = uVar22 + 1, local_228 = auVar88, uStack_214 = uVar21,
                      uStack_210 = uVar32, local_168 = auVar95, size != uVar36; uVar36 = uVar36 + 1)
                  {
                    auVar80._0_4_ = auVar92._0_4_ - open;
                    auVar80._4_4_ = auVar92._4_4_ - open;
                    auVar80._8_4_ = auVar92._8_4_ - open;
                    auVar80._12_4_ = auVar92._12_4_ - open;
                    auVar43._0_4_ = auVar81._0_4_ - gap;
                    auVar43._4_4_ = auVar81._4_4_ - gap;
                    auVar43._8_4_ = auVar81._8_4_ - gap;
                    auVar43._12_4_ = auVar81._12_4_ - gap;
                    auVar106._0_4_ = -(uint)(auVar43._0_4_ < auVar80._0_4_);
                    auVar106._4_4_ = -(uint)(auVar43._4_4_ < auVar80._4_4_);
                    auVar106._8_4_ = -(uint)(auVar43._8_4_ < auVar80._8_4_);
                    auVar106._12_4_ = -(uint)(auVar43._12_4_ < auVar80._12_4_);
                    auVar84 = *(undefined1 (*) [16])((long)*ptr + lVar31);
                    auVar81 = auVar80 & auVar106 | ~auVar106 & auVar43;
                    auVar92 = *(undefined1 (*) [16])((long)*b + lVar31);
                    auVar85 = auVar58 & auVar106 | ~auVar106 & auVar85;
                    auVar97 = auVar131 & auVar106 | ~auVar106 & auVar97;
                    auVar71 = ~auVar106 & auVar64 | auVar71 & auVar106;
                    auVar64._0_4_ = auVar71._0_4_ + 1;
                    auVar64._4_4_ = auVar71._4_4_ + 1;
                    auVar64._8_4_ = auVar71._8_4_ + 1;
                    auVar64._12_4_ = auVar71._12_4_ + 1;
                    auVar68._0_4_ = -(uint)(auVar92._0_4_ < auVar84._0_4_);
                    auVar68._4_4_ = -(uint)(auVar92._4_4_ < auVar84._4_4_);
                    auVar68._8_4_ = -(uint)(auVar92._8_4_ < auVar84._8_4_);
                    auVar68._12_4_ = -(uint)(auVar92._12_4_ < auVar84._12_4_);
                    auVar71 = ~auVar68 & auVar92 | auVar84 & auVar68;
                    auVar44._0_4_ = -(uint)(auVar81._0_4_ < auVar71._0_4_);
                    auVar44._4_4_ = -(uint)(auVar81._4_4_ < auVar71._4_4_);
                    auVar44._8_4_ = -(uint)(auVar81._8_4_ < auVar71._8_4_);
                    auVar44._12_4_ = -(uint)(auVar81._12_4_ < auVar71._12_4_);
                    auVar92 = auVar71 & auVar44 | ~auVar44 & auVar81;
                    iVar57 = auVar92._0_4_;
                    auVar65._0_4_ = -(uint)(auVar84._0_4_ == iVar57);
                    iVar35 = auVar92._4_4_;
                    auVar65._4_4_ = -(uint)(auVar84._4_4_ == iVar35);
                    iVar60 = auVar92._8_4_;
                    auVar65._8_4_ = -(uint)(auVar84._8_4_ == iVar60);
                    iVar61 = auVar92._12_4_;
                    auVar65._12_4_ = -(uint)(auVar84._12_4_ == iVar61);
                    auVar58 = *(undefined1 (*) [16])((long)*b_03 + lVar31) & auVar65 |
                              ~auVar65 &
                              (~auVar44 & auVar85 |
                              *(undefined1 (*) [16])((long)*b_00 + lVar31) & auVar44);
                    auVar131 = *(undefined1 (*) [16])((long)*b_04 + lVar31) & auVar65 |
                               ~auVar65 &
                               (~auVar44 & auVar97 |
                               *(undefined1 (*) [16])((long)*b_01 + lVar31) & auVar44);
                    auVar71 = auVar65 & *(undefined1 (*) [16])((long)*b_05 + lVar31) |
                              ~auVar65 &
                              (~auVar44 & auVar64 |
                              *(undefined1 (*) [16])((long)*b_02 + lVar31) & auVar44);
                    auVar52._0_4_ = -(uint)(iVar57 < auVar53._0_4_);
                    auVar52._4_4_ = -(uint)(iVar35 < auVar53._4_4_);
                    auVar52._8_4_ = -(uint)(iVar60 < auVar53._8_4_);
                    auVar52._12_4_ = -(uint)(iVar61 < auVar53._12_4_);
                    auVar53 = ~auVar52 & auVar53 | auVar92 & auVar52;
                    auVar45._0_4_ = -(uint)(iVar57 < local_128._0_4_);
                    auVar45._4_4_ = -(uint)(iVar35 < local_128._4_4_);
                    auVar45._8_4_ = -(uint)(iVar60 < local_128._8_4_);
                    auVar45._12_4_ = -(uint)(iVar61 < local_128._12_4_);
                    auVar84 = ~auVar45 & auVar92 | local_128 & auVar45;
                    auVar54._0_4_ = -(uint)(auVar58._0_4_ < auVar84._0_4_);
                    auVar54._4_4_ = -(uint)(auVar58._4_4_ < auVar84._4_4_);
                    auVar54._8_4_ = -(uint)(auVar58._8_4_ < auVar84._8_4_);
                    auVar54._12_4_ = -(uint)(auVar58._12_4_ < auVar84._12_4_);
                    auVar84 = ~auVar54 & auVar58 | auVar84 & auVar54;
                    auVar46._0_4_ = -(uint)(auVar131._0_4_ < auVar84._0_4_);
                    auVar46._4_4_ = -(uint)(auVar131._4_4_ < auVar84._4_4_);
                    auVar46._8_4_ = -(uint)(auVar131._8_4_ < auVar84._8_4_);
                    auVar46._12_4_ = -(uint)(auVar131._12_4_ < auVar84._12_4_);
                    auVar84 = ~auVar46 & auVar131 | auVar84 & auVar46;
                    auVar55._0_4_ = -(uint)(auVar71._0_4_ < auVar84._0_4_);
                    auVar55._4_4_ = -(uint)(auVar71._4_4_ < auVar84._4_4_);
                    auVar55._8_4_ = -(uint)(auVar71._8_4_ < auVar84._8_4_);
                    auVar55._12_4_ = -(uint)(auVar71._12_4_ < auVar84._12_4_);
                    local_128 = ~auVar55 & auVar71 | auVar84 & auVar55;
                    *(undefined1 (*) [16])((long)*ptr + lVar31) = auVar92;
                    *(undefined1 (*) [16])((long)*b_03 + lVar31) = auVar58;
                    *(undefined1 (*) [16])((long)*b_04 + lVar31) = auVar131;
                    *(undefined1 (*) [16])((long)*b_05 + lVar31) = auVar71;
                    vH[0] = uVar36 & 0xffffffff;
                    t = (int32_t)uVar22;
                    vH[1] = size;
                    palVar34 = b_03;
                    arr_store_si128(*((ppVar20->field_4).trace)->trace_del_table,vH,t,s2Len,
                                    (int)b_03,in_stack_fffffffffffffd68);
                    vH_00[0] = uVar36 & 0xffffffff;
                    vH_00[1] = size;
                    d = (int32_t)palVar34;
                    arr_store_si128(*(int **)((long)((ppVar20->field_4).trace)->trace_del_table + 8)
                                    ,vH_00,t,s2Len,d,in_stack_fffffffffffffd68);
                    vH_01[0] = uVar36 & 0xffffffff;
                    vH_01[1] = size;
                    arr_store_si128(*(int **)((long)((ppVar20->field_4).trace)->trace_del_table +
                                             0x10),vH_01,t,s2Len,d,in_stack_fffffffffffffd68);
                    vH_02[0] = uVar36 & 0xffffffff;
                    vH_02[1] = size;
                    arr_store_si128(*(int **)((long)((ppVar20->field_4).trace)->trace_del_table +
                                             0x18),vH_02,t,s2Len,d,in_stack_fffffffffffffd68);
                    lVar31 = lVar31 + 0x10;
                  }
                }
                alVar66 = ptr[uVar39];
                alVar59 = b_03[uVar39];
                alVar56 = b_04[uVar39];
                alVar47 = b_05[uVar39];
                iVar57 = 0;
                while( true ) {
                  lVar67 = alVar66[1];
                  lVar62 = alVar59[1];
                  lVar30 = alVar56[1];
                  lVar31 = alVar47[1];
                  if (3 - (int)(uVar27 / size) <= iVar57) break;
                  uVar39 = alVar66[0];
                  alVar66[0] = uVar39 << 0x20;
                  alVar66[1] = lVar67 << 0x20 | uVar39 >> 0x20;
                  uVar39 = alVar59[0];
                  alVar59[0] = uVar39 << 0x20;
                  alVar59[1] = lVar62 << 0x20 | uVar39 >> 0x20;
                  uVar39 = alVar56[0];
                  alVar56[0] = uVar39 << 0x20;
                  alVar56[1] = lVar30 << 0x20 | uVar39 >> 0x20;
                  uVar39 = alVar47[0];
                  alVar47[0] = uVar39 << 0x20;
                  alVar47[1] = lVar31 << 0x20 | uVar39 >> 0x20;
                  iVar57 = iVar57 + 1;
                }
                auVar69._0_4_ = -(uint)(auVar53._0_4_ < iVar17);
                auVar69._4_4_ = -(uint)(auVar53._4_4_ < iVar17);
                auVar69._8_4_ = -(uint)(auVar53._8_4_ < iVar17);
                auVar69._12_4_ = -(uint)(auVar53._12_4_ < iVar17);
                auVar75._0_4_ = -(uint)((int)uVar15 < (int)local_128._0_4_);
                auVar75._4_4_ = -(uint)((int)uVar15 < (int)local_128._4_4_);
                auVar75._8_4_ = -(uint)((int)uVar15 < (int)local_128._8_4_);
                auVar75._12_4_ = -(uint)((int)uVar15 < (int)local_128._12_4_);
                iVar57 = movmskps(iVar57,auVar75 | auVar69);
                if (iVar57 == 0) {
                  iVar57 = alVar66[1]._4_4_;
                  iVar35 = alVar59[1]._4_4_;
                  iVar60 = alVar56[1]._4_4_;
                  iVar61 = alVar47[1]._4_4_;
                }
                else {
                  *(byte *)&ppVar20->flag = (byte)ppVar20->flag | 0x40;
                  iVar57 = 0;
                  iVar35 = 0;
                  iVar60 = 0;
                  iVar61 = 0;
                  iVar16 = 0;
                  uVar27 = 0;
                }
                ppVar20->score = iVar57;
                ppVar20->end_query = uVar27;
                ppVar20->end_ref = iVar16;
                ((ppVar20->field_4).stats)->matches = iVar35;
                ((ppVar20->field_4).stats)->similar = iVar60;
                ((ppVar20->field_4).stats)->length = iVar61;
                parasail_free(ptr_06);
                parasail_free(ptr_05);
                parasail_free(ptr_04);
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(b_05);
                parasail_free(b_04);
                parasail_free(b_03);
                parasail_free(ptr);
                parasail_free(b_02);
                parasail_free(b_01);
                parasail_free(b_00);
                parasail_free(b);
                return ppVar20;
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar26 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_stats_table_scan_profile_sse2_128_32",pcVar26);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile32.score;
    pvPm = (__m128i*)profile->profile32.matches;
    pvPs = (__m128i*)profile->profile32.similar;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi32(segLen), 4);
    vNegInfFront = _mm_insert_epi32_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi32(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi32(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi32(vGapper, vGapE);
            vGapperL = _mm_add_epi32(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 4);
        vHpM = _mm_slli_si128(vHpM, 4);
        vHpS = _mm_slli_si128(vHpS, 4);
        vHpL = _mm_slli_si128(vHpL, 4);
        vHp = _mm_insert_epi32_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi32(vH, vGapO);
            vE_ext = _mm_sub_epi32(vE, vGapE);
            case1 = _mm_cmpgt_epi32(vE_opn, vE_ext);
            vE = _mm_max_epi32_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8_rpl(vEM, vHM, case1);
            vES = _mm_blendv_epi8_rpl(vES, vHS, case1);
            vEL = _mm_blendv_epi8_rpl(vEL, vHL, case1);
            vEL = _mm_add_epi32(vEL, vOne);
            vGapper = _mm_add_epi32(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vF, vGapper),
                    _mm_cmpeq_epi32(vF, vGapper));
            vF = _mm_max_epi32_rpl(vF, vGapper);
            vFM = _mm_blendv_epi8_rpl(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8_rpl(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8_rpl(
                    _mm_add_epi32(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi32(vHp, vW);
            vHpM = _mm_add_epi32(vHpM, vWM);
            vHpS = _mm_add_epi32(vHpS, vWS);
            vHpL = _mm_add_epi32(vHpL, vOne);
            case1 = _mm_cmpgt_epi32(vE, vHp);
            vHt = _mm_max_epi32_rpl(vE, vHp);
            vHtM = _mm_blendv_epi8_rpl(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8_rpl(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8_rpl(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 4);
        vHtM = _mm_slli_si128(vHtM, 4);
        vHtS = _mm_slli_si128(vHtS, 4);
        vHtL = _mm_slli_si128(vHtL, 4);
        vHt = _mm_insert_epi32_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi32(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi32(vGapper, vF),
                _mm_cmpeq_epi32(vGapper, vF));
        vF = _mm_max_epi32_rpl(vF, vGapper);
        vFM = _mm_blendv_epi8_rpl(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8_rpl(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8_rpl(
                vFL,
                _mm_add_epi32(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 4);
            __m128i vFtM = _mm_slli_si128(vFM, 4);
            __m128i vFtS = _mm_slli_si128(vFS, 4);
            __m128i vFtL = _mm_slli_si128(vFL, 4);
            vFt = _mm_add_epi32(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi32(vFt, vF),
                    _mm_cmpeq_epi32(vFt, vF));
            vF = _mm_max_epi32_rpl(vF, vFt);
            vFM = _mm_blendv_epi8_rpl(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8_rpl(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8_rpl(
                    vFL,
                    _mm_add_epi32(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 4);
        vFM = _mm_slli_si128(vFM, 4);
        vFS = _mm_slli_si128(vFS, 4);
        vFL = _mm_slli_si128(vFL, 4);
        vF = _mm_add_epi32(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi32(vF, vHt);
        vH = _mm_max_epi32_rpl(vF, vHt);
        vHM = _mm_blendv_epi8_rpl(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8_rpl(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8_rpl(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi32(vH, vGapO);
            vF_ext = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8_rpl(vFM, vHM, case1);
            vFS = _mm_blendv_epi8_rpl(vFS, vHS, case1);
            vFL = _mm_blendv_epi8_rpl(vFL, vHL, case1);
            vFL = _mm_add_epi32(vFL, vOne);
            vH = _mm_max_epi32_rpl(vHp, vE);
            vH = _mm_max_epi32_rpl(vH, vF);
            case1 = _mm_cmpeq_epi32(vH, vHp);
            case2 = _mm_cmpeq_epi32(vH, vF);
            vHM = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8_rpl(
                    _mm_blendv_epi8_rpl(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi32_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi32_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
                vHM = _mm_slli_si128(vHM, 4);
                vHS = _mm_slli_si128(vHS, 4);
                vHL = _mm_slli_si128(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm_extract_epi32_rpl (vH, 3);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm_extract_epi32_rpl (vHM, 3);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm_extract_epi32_rpl (vHS, 3);
            result->stats->rowcols->length_row[j] = (int32_t) _mm_extract_epi32_rpl (vHL, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 4);
            vHM = _mm_slli_si128(vHM, 4);
            vHS = _mm_slli_si128(vHS, 4);
            vHL = _mm_slli_si128(vHL, 4);
        }
        score = (int32_t) _mm_extract_epi32_rpl (vH, 3);
        matches = (int32_t) _mm_extract_epi32_rpl (vHM, 3);
        similar = (int32_t) _mm_extract_epi32_rpl (vHS, 3);
        length = (int32_t) _mm_extract_epi32_rpl (vHL, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}